

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O0

void __thiscall TcpConnection::set_sockfd(TcpConnection *this,int *fd)

{
  undefined4 local_20;
  uint local_1c;
  int op;
  int flag;
  int *fd_local;
  TcpConnection *this_local;
  
  _op = fd;
  fd_local = (int *)this;
  local_1c = fcntl(*fd,3,0);
  fcntl(*_op,4,(ulong)(local_1c | 0x800));
  local_20 = 1;
  setsockopt(*_op,6,1,&local_20,4);
  return;
}

Assistant:

void TcpConnection::set_sockfd(int& fd) {
    int flag = fcntl(fd, F_GETFL, 0);
    fcntl(fd, F_SETFL, O_NONBLOCK|flag);
    int op = 1;
    setsockopt(fd, IPPROTO_TCP, TCP_NODELAY, &op, sizeof(op));
}